

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::remapEntryPointIO
          (HlslParseContext *this,TFunction *function,TVariable **returnValue,
          TVector<glslang::TVariable_*> *inputs,TVector<glslang::TVariable_*> *outputs)

{
  ulong *puVar1;
  pointer *pppTVar2;
  _Rb_tree_header *p_Var3;
  EShLanguage EVar4;
  uint uVar5;
  ulong uVar6;
  TType *type;
  TTypeList *pTVar7;
  iterator __position;
  iterator iVar8;
  long *plVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *pTVar13;
  undefined4 extraout_var_01;
  TPoolAllocator *pTVar14;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_02;
  long lVar15;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _Base_ptr p_Var16;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_01;
  _func_int **pp_Var17;
  anon_union_8_2_8ac53c11_for_TType_13 this_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  mapped_type *pmVar18;
  ulong uVar19;
  _Base_ptr p_Var20;
  uint uVar21;
  _Rb_tree_header *p_Var22;
  char *pcVar23;
  undefined8 *puVar24;
  TType outputType;
  anon_union_8_2_8ac53c11_for_TType_13 local_c8;
  TString *pTStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  TSmallArrayVector *local_68;
  
  iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar12 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar12) + 0x38))
                     ((long *)CONCAT44(extraout_var,iVar12));
  if (iVar12 == 0) {
    *returnValue = (TVariable *)0x0;
  }
  else {
    EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
    iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    pTVar13 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)this,"@entryPointOutput",
                         (TType *)CONCAT44(extraout_var_00,iVar12),EvqVaryingOut);
    *returnValue = pTVar13;
    if (EVar4 == EShLangTessControl) {
      TType::TType((TType *)&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TType::shallowCopy((TType *)&local_c8,(TType *)CONCAT44(extraout_var_01,iVar12));
      pTVar14 = GetThreadPoolAllocator();
      this_00 = (TSmallArrayVector *)TPoolAllocator::allocate(pTVar14,0x18);
      this_00->_vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00af64d8;
      this_00->sizes = (TVector<glslang::TArraySize> *)0x0;
      *(undefined4 *)&this_00[1]._vptr_TSmallArrayVector = 0;
      *(undefined2 *)((long)&this_00[1]._vptr_TSmallArrayVector + 4) = 1;
      TSmallArrayVector::push_back
                (this_00,((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                         vertices,(TIntermTyped *)0x0);
      local_68 = this_00;
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
      lVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar12) + 0x50))
                         ((long *)CONCAT44(extraout_var_02,iVar12));
      uVar6 = *(ulong *)(lVar15 + 8);
      *(byte *)(lVar15 + 0x10) = *(byte *)(lVar15 + 0x10) & 0xf0;
      *(undefined8 *)(lVar15 + 0x14) = 0xffffffffffffffff;
      uVar19 = (ulong)(((uint)uVar6 & 0xff80) << 9);
      if ((uVar6 & 0x1ff0000) != 0) {
        uVar19 = 0;
      }
      *(undefined1 *)(lVar15 + 0x2d) = 0;
      *(ulong *)(lVar15 + 8) = uVar6 & 0x1fffc01f1fff007f | uVar19;
      *(ulong *)(lVar15 + 0x1c) =
           (ulong)(*(uint *)(lVar15 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff;
      *(ulong *)(lVar15 + 0x24) = *(ulong *)(lVar15 + 0x24) | 0xff7fffffff;
      pTVar13 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)this,"@entryPointOutput",(TType *)&local_c8,
                           EvqVaryingOut);
      *returnValue = pTVar13;
    }
  }
  iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar12) {
    p_Var3 = &(this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    uVar21 = 0;
    do {
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar21);
      type = *(TType **)(CONCAT44(extraout_var_03,iVar12) + 8);
      iVar12 = (*type->_vptr_TType[10])(type);
      uVar5 = *(uint *)(CONCAT44(extraout_var_04,iVar12) + 8);
      if (((uVar5 & 0x7f) < 0x14) && ((0xd0000U >> (uVar5 & 0x1f) & 1) != 0)) {
        if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) &&
           ((((iVar12 = (*type->_vptr_TType[0x32])(type,8), (char)iVar12 != '\0' ||
              (iVar12 = (*type->_vptr_TType[0x32])(type,9), (char)iVar12 != '\0')) ||
             (iVar12 = (*type->_vptr_TType[0x32])(type,10), (char)iVar12 != '\0')) ||
            (((iVar12 = (*type->_vptr_TType[0x32])(type,0xb), (char)iVar12 != '\0' ||
              (iVar12 = (*type->_vptr_TType[0x32])(type,0xc), (char)iVar12 != '\0')) ||
             (iVar12 = (*type->_vptr_TType[0x32])(type,2), (char)iVar12 != '\0')))))) {
          iVar12 = (*type->_vptr_TType[0x25])(type);
          if ((char)iVar12 == '\0') {
            iVar12 = (*type->_vptr_TType[10])(type);
            puVar1 = (ulong *)(CONCAT44(extraout_var_05,iVar12) + 8);
            *puVar1 = *puVar1 & 0xfffff01f1fffffff;
            iVar12 = (*type->_vptr_TType[10])(type);
            puVar1 = (ulong *)(CONCAT44(extraout_var_06,iVar12) + 8);
            *puVar1 = *puVar1 | 0x80000000;
          }
          else {
            iVar12 = (*type->_vptr_TType[0x25])();
            if ((char)iVar12 == '\0') goto LAB_0040b11c;
            p_Var20 = (this->ioTypeMap).
                      super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            bVar10 = true;
            p_Var22 = p_Var3;
            if (p_Var20 == (_Base_ptr)0x0) {
LAB_0040adf1:
              pTVar14 = GetThreadPoolAllocator();
              this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                        TPoolAllocator::allocate(pTVar14,0x20);
              *(undefined8 *)this_01 = 0;
              *(undefined8 *)(this_01 + 8) = 0;
              *(undefined8 *)(this_01 + 0x10) = 0;
              *(undefined8 *)(this_01 + 0x18) = 0;
              pTVar14 = GetThreadPoolAllocator();
              *(TPoolAllocator **)this_01 = pTVar14;
              *(undefined8 *)(this_01 + 8) = 0;
              *(undefined8 *)(this_01 + 0x10) = 0;
              *(undefined8 *)(this_01 + 0x18) = 0;
              iVar12 = (*type->_vptr_TType[0x25])(type);
              if ((char)iVar12 == '\0') {
LAB_0040b11c:
                __assert_fail("isStruct()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                              ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
              }
              pp_Var17 = type->_vptr_TType;
              pcVar23 = *(char **)&((type->field_13).referentType)->field_0x8;
              while( true ) {
                iVar12 = (*pp_Var17[0x25])(type);
                if ((char)iVar12 == '\0') goto LAB_0040b11c;
                if (pcVar23 == (((type->field_13).referentType)->qualifier).semanticName) break;
                pTVar14 = GetThreadPoolAllocator();
                this_02.structure = (TTypeList *)TPoolAllocator::allocate(pTVar14,0x98);
                TType::TType(this_02.referentType,EbtVoid,EvqTemporary,1,0,0,false);
                TType::shallowCopy(this_02.referentType,*(TType **)pcVar23);
                uStack_b0 = *(undefined8 *)(pcVar23 + 0x18);
                pTStack_c0 = *(TString **)(pcVar23 + 8);
                uStack_b8 = *(undefined8 *)(pcVar23 + 0x10);
                __position._M_current = *(TTypeLoc **)(this_01 + 0x10);
                local_c8.structure = this_02.structure;
                if (__position._M_current == *(TTypeLoc **)(this_01 + 0x18)) {
                  std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
                  _M_realloc_insert<glslang::TTypeLoc_const&>
                            (this_01,__position,(TTypeLoc *)&local_c8);
                }
                else {
                  ((__position._M_current)->loc).string = (int)uStack_b8;
                  ((__position._M_current)->loc).line = (int)((ulong)uStack_b8 >> 0x20);
                  *(undefined8 *)&((__position._M_current)->loc).column = uStack_b0;
                  (__position._M_current)->type = (TType *)this_02;
                  ((__position._M_current)->loc).name = pTStack_c0;
                  *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 0x20;
                }
                pcVar23 = pcVar23 + 0x20;
                pp_Var17 = type->_vptr_TType;
              }
              if (bVar10) {
                iVar12 = (*type->_vptr_TType[0x25])(type);
                if ((char)iVar12 == '\0') goto LAB_0040b11c;
                local_c8 = type->field_13;
                pmVar18 = std::
                          map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          ::operator[](&(this->ioTypeMap).
                                        super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                                       ,&local_c8.structure);
                pmVar18->input = (TTypeList *)this_01;
                pmVar18->output = (TTypeList *)0x0;
                pmVar18->uniform = (TTypeList *)0x0;
              }
              else {
                *(vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> **)
                 (p_Var22 + 1) = this_01;
              }
            }
            else {
              pTVar7 = (type->field_13).structure;
              p_Var16 = &p_Var3->_M_header;
              do {
                if (*(TTypeList **)(p_Var20 + 1) >= pTVar7) {
                  p_Var16 = p_Var20;
                }
                p_Var20 = (&p_Var20->_M_left)[*(TTypeList **)(p_Var20 + 1) < pTVar7];
              } while (p_Var20 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var16 == p_Var3) ||
                 (pTVar7 < (TTypeList *)((_Rb_tree_header *)p_Var16)->_M_node_count))
              goto LAB_0040adf1;
              this_01 = *(vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> **)
                         ((long)p_Var16 + 0x28);
              if (this_01 ==
                  (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
                bVar10 = false;
                p_Var22 = (_Rb_tree_header *)p_Var16;
                goto LAB_0040adf1;
              }
            }
            for (puVar24 = *(undefined8 **)(this_01 + 8);
                puVar24 != *(undefined8 **)(this_01 + 0x10); puVar24 = puVar24 + 4) {
              plVar9 = (long *)*puVar24;
              cVar11 = (**(code **)(*plVar9 + 400))(plVar9,8);
              if (((((cVar11 != '\0') ||
                    (cVar11 = (**(code **)(*plVar9 + 400))(plVar9,9), cVar11 != '\0')) ||
                   (cVar11 = (**(code **)(*plVar9 + 400))(plVar9,10), cVar11 != '\0')) ||
                  ((cVar11 = (**(code **)(*plVar9 + 400))(plVar9,0xb), cVar11 != '\0' ||
                   (cVar11 = (**(code **)(*plVar9 + 400))(plVar9,0xc), cVar11 != '\0')))) ||
                 (cVar11 = (**(code **)(*plVar9 + 400))(plVar9,2), cVar11 != '\0')) {
                lVar15 = (**(code **)(*(long *)*puVar24 + 0x50))();
                *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) & 0xfffff01f1fffffff;
                lVar15 = (**(code **)(*(long *)*puVar24 + 0x50))();
                *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) | 0x80000000;
              }
            }
          }
        }
        iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar21);
        local_c8.structure =
             (TTypeList *)
             remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)this,
                        *(char **)(*(long *)CONCAT44(extraout_var_07,iVar12) + 8),type,EvqVaryingIn)
        ;
        iVar8._M_current =
             (inputs->
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>).
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (inputs->
            super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>).
            super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
          _M_realloc_insert<glslang::TVariable*const&>
                    ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                     inputs,iVar8,(TVariable **)&local_c8.structure);
        }
        else {
          *iVar8._M_current = (TVariable *)local_c8;
          pppTVar2 = &(inputs->
                      super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ).
                      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
      }
      iVar12 = (*type->_vptr_TType[10])(type);
      if ((*(uint *)(CONCAT44(extraout_var_08,iVar12) + 8) & 0x7f) - 0x11 < 2) {
        iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar21);
        local_c8.structure =
             (TTypeList *)
             remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)this,
                        *(char **)(*(long *)CONCAT44(extraout_var_09,iVar12) + 8),type,EvqVaryingOut
                       );
        iVar8._M_current =
             (outputs->
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>).
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (outputs->
            super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>).
            super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
          _M_realloc_insert<glslang::TVariable*const&>
                    ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                     outputs,iVar8,(TVariable **)&local_c8.structure);
        }
        else {
          *iVar8._M_current = (TVariable *)local_c8;
          pppTVar2 = &(outputs->
                      super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ).
                      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
      }
      uVar21 = uVar21 + 1;
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar21 < iVar12);
  }
  return;
}

Assistant:

void HlslParseContext::remapEntryPointIO(TFunction& function, TVariable*& returnValue,
    TVector<TVariable*>& inputs, TVector<TVariable*>& outputs)
{
    // We might have in input structure type with no decorations that caused it
    // to look like an input type, yet it has (e.g.) interpolation types that
    // must be modified that turn it into an input type.
    // Hence, a missing ioTypeMap for 'input' might need to be synthesized.
    const auto synthesizeEditedInput = [this](TType& type) {
        // True if a type needs to be 'flat'
        const auto needsFlat = [](const TType& type) {
            return type.containsBasicType(EbtInt) ||
                    type.containsBasicType(EbtUint) ||
                    type.containsBasicType(EbtInt64) ||
                    type.containsBasicType(EbtUint64) ||
                    type.containsBasicType(EbtBool) ||
                    type.containsBasicType(EbtDouble);
        };

        if (language == EShLangFragment && needsFlat(type)) {
            if (type.isStruct()) {
                TTypeList* finalList = nullptr;
                auto it = ioTypeMap.find(type.getStruct());
                if (it == ioTypeMap.end() || it->second.input == nullptr) {
                    // Getting here means we have no input struct, but we need one.
                    auto list = new TTypeList;
                    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
                        TType* newType = new TType;
                        newType->shallowCopy(*member->type);
                        TTypeLoc typeLoc = { newType, member->loc };
                        list->push_back(typeLoc);
                    }
                    // install the new input type
                    if (it == ioTypeMap.end()) {
                        tIoKinds newLists = { list, nullptr, nullptr };
                        ioTypeMap[type.getStruct()] = newLists;
                    } else
                        it->second.input = list;
                    finalList = list;
                } else
                    finalList = it->second.input;
                // edit for 'flat'
                for (auto member = finalList->begin(); member != finalList->end(); ++member) {
                    if (needsFlat(*member->type)) {
                        member->type->getQualifier().clearInterpolation();
                        member->type->getQualifier().flat = true;
                    }
                }
            } else {
                type.getQualifier().clearInterpolation();
                type.getQualifier().flat = true;
            }
        }
    };

    // Do the actual work to make a type be a shader input or output variable,
    // and clear the original to be non-IO (for use as a normal function parameter/return).
    const auto makeIoVariable = [this](const char* name, TType& type, TStorageQualifier storage) -> TVariable* {
        TVariable* ioVariable = makeInternalVariable(name, type);
        clearUniformInputOutput(type.getQualifier());
        if (type.isStruct()) {
            auto newLists = ioTypeMap.find(ioVariable->getType().getStruct());
            if (newLists != ioTypeMap.end()) {
                if (storage == EvqVaryingIn && newLists->second.input)
                    ioVariable->getWritableType().setStruct(newLists->second.input);
                else if (storage == EvqVaryingOut && newLists->second.output)
                    ioVariable->getWritableType().setStruct(newLists->second.output);
            }
        }
        if (storage == EvqVaryingIn) {
            correctInput(ioVariable->getWritableType().getQualifier());
            if (language == EShLangTessEvaluation)
                if (!ioVariable->getType().isArray())
                    ioVariable->getWritableType().getQualifier().patch = true;
        } else {
            correctOutput(ioVariable->getWritableType().getQualifier());
        }
        ioVariable->getWritableType().getQualifier().storage = storage;

        fixBuiltInIoType(ioVariable->getWritableType());

        return ioVariable;
    };

    // return value is actually a shader-scoped output (out)
    if (function.getType().getBasicType() == EbtVoid) {
        returnValue = nullptr;
    } else {
        if (language == EShLangTessControl) {
            // tessellation evaluation in HLSL writes a per-ctrl-pt value, but it needs to be an
            // array in SPIR-V semantics.  We'll write to it indexed by invocation ID.

            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);

            TType outputType;
            outputType.shallowCopy(function.getType());

            // vertices has necessarily already been set when handling entry point attributes.
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(intermediate.getVertices());
            outputType.transferArraySizes(arraySizes);

            clearUniformInputOutput(function.getWritableType().getQualifier());
            returnValue = makeIoVariable("@entryPointOutput", outputType, EvqVaryingOut);
        } else {
            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);
        }
    }

    // parameters are actually shader-scoped inputs and outputs (in or out)
    for (int i = 0; i < function.getParamCount(); i++) {
        TType& paramType = *function[i].type;
        if (paramType.getQualifier().isParamInput()) {
            synthesizeEditedInput(paramType);
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingIn);
            inputs.push_back(argAsGlobal);
        }
        if (paramType.getQualifier().isParamOutput()) {
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingOut);
            outputs.push_back(argAsGlobal);
        }
    }
}